

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

WebPEncodingError AllocateTransformBuffer(VP8LEncoder *enc,int width,int height)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  ulong uVar4;
  void *nmemb;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  uint32_t *mem;
  uint64_t mem_size;
  uint64_t max_alignment_in_words;
  uint64_t transform_data_size;
  uint64_t argb_scratch_size;
  uint64_t image_size;
  WebPEncodingError err;
  uint local_54;
  size_t sVar5;
  
  if (*(int *)(in_RDI + 0x58) == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = (long)(int)((in_ESI + 1) * 2) + ((long)(int)(in_ESI << 1) + 3U >> 2);
  }
  sVar5 = sVar3;
  if ((*(int *)(in_RDI + 0x58) == 0) && (*(int *)(in_RDI + 0x50) == 0)) {
    local_54 = 0;
  }
  else {
    uVar1 = VP8LSubSampleSize(in_ESI,*(uint32_t *)(in_RDI + 0x48));
    uVar2 = VP8LSubSampleSize(in_EDX,*(uint32_t *)(in_RDI + 0x48));
    local_54 = uVar1 * uVar2;
  }
  uVar4 = (long)(int)(in_ESI * in_EDX) + sVar3 + 0x10 + (ulong)local_54;
  nmemb = *(void **)(in_RDI + 0x30);
  if ((nmemb == (void *)0x0) || (*(ulong *)(in_RDI + 0x38) < uVar4)) {
    ClearTransformBuffer((VP8LEncoder *)0x1809e2);
    nmemb = WebPSafeMalloc((uint64_t)nmemb,sVar5);
    if (nmemb == (void *)0x0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    *(void **)(in_RDI + 0x30) = nmemb;
    *(ulong *)(in_RDI + 0x38) = uVar4;
    *(undefined4 *)(in_RDI + 0x18) = 0;
  }
  *(void **)(in_RDI + 0x10) = nmemb;
  uVar4 = (long)nmemb + (long)(int)(in_ESI * in_EDX) * 4 + 0x1f & 0xffffffffffffffe0;
  *(ulong *)(in_RDI + 0x20) = uVar4;
  *(ulong *)(in_RDI + 0x28) = uVar4 + sVar3 * 4 + 0x1f & 0xffffffffffffffe0;
  *(uint32_t *)(in_RDI + 0x40) = in_ESI;
  return VP8_ENC_OK;
}

Assistant:

static WebPEncodingError AllocateTransformBuffer(VP8LEncoder* const enc,
                                                 int width, int height) {
  WebPEncodingError err = VP8_ENC_OK;
  const uint64_t image_size = width * height;
  // VP8LResidualImage needs room for 2 scanlines of uint32 pixels with an extra
  // pixel in each, plus 2 regular scanlines of bytes.
  // TODO(skal): Clean up by using arithmetic in bytes instead of words.
  const uint64_t argb_scratch_size =
      enc->use_predict_
          ? (width + 1) * 2 +
            (width * 2 + sizeof(uint32_t) - 1) / sizeof(uint32_t)
          : 0;
  const uint64_t transform_data_size =
      (enc->use_predict_ || enc->use_cross_color_)
          ? VP8LSubSampleSize(width, enc->transform_bits_) *
                VP8LSubSampleSize(height, enc->transform_bits_)
          : 0;
  const uint64_t max_alignment_in_words =
      (WEBP_ALIGN_CST + sizeof(uint32_t) - 1) / sizeof(uint32_t);
  const uint64_t mem_size =
      image_size + max_alignment_in_words +
      argb_scratch_size + max_alignment_in_words +
      transform_data_size;
  uint32_t* mem = enc->transform_mem_;
  if (mem == NULL || mem_size > enc->transform_mem_size_) {
    ClearTransformBuffer(enc);
    mem = (uint32_t*)WebPSafeMalloc(mem_size, sizeof(*mem));
    if (mem == NULL) {
      err = VP8_ENC_ERROR_OUT_OF_MEMORY;
      goto Error;
    }
    enc->transform_mem_ = mem;
    enc->transform_mem_size_ = (size_t)mem_size;
    enc->argb_content_ = kEncoderNone;
  }
  enc->argb_ = mem;
  mem = (uint32_t*)WEBP_ALIGN(mem + image_size);
  enc->argb_scratch_ = mem;
  mem = (uint32_t*)WEBP_ALIGN(mem + argb_scratch_size);
  enc->transform_data_ = mem;

  enc->current_width_ = width;
 Error:
  return err;
}